

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O1

monster_race * lookup_monster(char *name)

{
  char *__s2;
  bool bVar1;
  int iVar2;
  wchar_t wVar3;
  monster_race *in_RAX;
  monster_race *pmVar4;
  ulong uVar5;
  long lVar6;
  monster_race *pmVar7;
  monster_race *local_38;
  
  if (z_info->r_max == 0) {
    pmVar4 = (monster_race *)0x0;
  }
  else {
    lVar6 = 0;
    uVar5 = 0;
    pmVar4 = (monster_race *)0x0;
    local_38 = in_RAX;
    do {
      __s2 = *(char **)(r_info->flags + lVar6 + -0x4c);
      if (__s2 == (char *)0x0) {
        bVar1 = false;
      }
      else {
        pmVar7 = (monster_race *)(r_info->flags + lVar6 + -0x5c);
        iVar2 = strcmp(name,__s2);
        if (iVar2 == 0) {
          bVar1 = true;
          local_38 = pmVar7;
        }
        else {
          wVar3 = my_stricmp(name,__s2);
          if (wVar3 == L'\0') {
            pmVar4 = pmVar7;
          }
          bVar1 = false;
          if ((pmVar4 == (monster_race *)0x0) &&
             (pmVar4 = (monster_race *)my_stristr(pmVar7->name,name), pmVar4 != (monster_race *)0x0)
             ) {
            pmVar4 = pmVar7;
          }
        }
      }
      if (bVar1) {
        return local_38;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0xd0;
    } while (uVar5 < z_info->r_max);
  }
  return pmVar4;
}

Assistant:

struct monster_race *lookup_monster(const char *name)
{
	int i;
	struct monster_race *closest = NULL;

	/* Look for it */
	for (i = 0; i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];
		if (!race->name)
			continue;

		/* Test for equality */
		if (streq(name, race->name))
			return race;

		/* Test for near equality */
		if (my_stricmp(name, race->name) == 0)
			closest = race;

		/* Test for close matches */
		if (!closest && my_stristr(race->name, name))
			closest = race;
	}

	/* Return our best match */
	return closest;
}